

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Vec_Int_t * Vta_ManCollectNodes(Vta_Man_t *p,int f)

{
  int iObj;
  Gia_Obj_t *pObj_00;
  Vta_Obj_t *pThis_00;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis;
  int f_local;
  Vta_Man_t *p_local;
  
  Vec_IntClear(p->vOrder);
  pObj_00 = Gia_ManPo(p->pGia,0);
  iObj = Gia_ObjFaninId0p(p->pGia,pObj_00);
  pThis_00 = Vga_ManFind(p,iObj,f);
  if (pThis_00 == (Vta_Obj_t *)0x0) {
    __assert_fail("pThis != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1ee,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
  if (-1 < *(int *)&pThis_00->field_0xc) {
    Vta_ManCollectNodes_rec(p,pThis_00,p->vOrder);
    if (*(int *)&pThis_00->field_0xc < 0) {
      return p->vOrder;
    }
    __assert_fail("pThis->fVisit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x1f1,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
  }
  __assert_fail("!pThis->fVisit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                ,0x1ef,"Vec_Int_t *Vta_ManCollectNodes(Vta_Man_t *, int)");
}

Assistant:

Vec_Int_t * Vta_ManCollectNodes( Vta_Man_t * p, int f )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    Vec_IntClear( p->vOrder );
    pObj = Gia_ManPo( p->pGia, 0 );
    pThis = Vga_ManFind( p, Gia_ObjFaninId0p(p->pGia, pObj), f );
    assert( pThis != NULL );
    assert( !pThis->fVisit );
    Vta_ManCollectNodes_rec( p, pThis, p->vOrder );
    assert( pThis->fVisit );
    return p->vOrder;
}